

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O0

void __thiscall jbcoin::openssl::secp256k1_data::secp256k1_data(secp256k1_data *this)

{
  EC_GROUP *pEVar1;
  bignum local_58;
  bn_ctx local_50;
  bn_ctx ctx;
  string local_40;
  secp256k1_data *local_10;
  secp256k1_data *this_local;
  
  local_10 = this;
  bignum::bignum(&this->order);
  pEVar1 = EC_GROUP_new_by_curve_name(0x2ca);
  this->group = (EC_GROUP *)pEVar1;
  if (this->group == (EC_GROUP *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,
               "The OpenSSL library on this system lacks elliptic curve support.",
               (allocator *)((long)&ctx.ptr + 7));
    LogicError(&local_40);
  }
  bn_ctx::bn_ctx(&local_50);
  get_order((openssl *)&local_58,this->group,&local_50);
  bignum::operator=(&this->order,&local_58);
  bignum::~bignum(&local_58);
  bn_ctx::~bn_ctx(&local_50);
  return;
}

Assistant:

secp256k1_data ()
    {
        group = EC_GROUP_new_by_curve_name (NID_secp256k1);

        if (!group)
            LogicError ("The OpenSSL library on this system lacks elliptic curve support.");

        bn_ctx ctx;
        order = get_order (group, ctx);
    }